

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

int __thiscall
QTextDocumentPrivate::remove_string(QTextDocumentPrivate *this,int pos,uint length,Operation op)

{
  BlockMap *this_00;
  uint *puVar1;
  uint uVar2;
  quint32 qVar3;
  QTextBlockData *pQVar4;
  QTextLayout *pQVar5;
  uint uVar6;
  uint z;
  long lVar7;
  quint32 qVar8;
  uint uVar9;
  uint uVar10;
  
  this_00 = &this->blocks;
  uVar6 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos,0);
  z = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,pos,0);
  pQVar4 = (this->blocks).data.field_0.fragments;
  uVar2 = pQVar4[uVar6].super_QFragment<3>.parent;
  qVar3 = pQVar4[uVar6].super_QFragment<3>.size_array[0];
  qVar8 = qVar3 - length;
  pQVar4[uVar6].super_QFragment<3>.size_array[0] = qVar8;
  if (uVar2 != 0) {
    uVar10 = uVar6;
    do {
      uVar9 = uVar2;
      puVar1 = (uint *)((long)(this_00->data).field_0.head + (ulong)uVar9 * 0x48);
      if (puVar1[1] == uVar10) {
        puVar1[4] = puVar1[4] + (qVar8 - qVar3);
      }
      uVar2 = *puVar1;
      uVar10 = uVar9;
    } while (*puVar1 != 0);
  }
  if ((uVar6 != 0) &&
     (pQVar5 = (this_00->data).field_0.fragments[uVar6].layout, pQVar5 != (QTextLayout *)0x0)) {
    QTextEngine::invalidate(pQVar5->d);
  }
  objectForFormat(this,(this->fragments).data.field_0.fragments[z].format);
  lVar7 = QMetaObject::cast((QObject *)&QTextFrame::staticMetaObject);
  if (lVar7 != 0) {
    (**(code **)(**(long **)(lVar7 + 8) + 0x28))
              (*(long **)(lVar7 + 8),
               (this->text).d.ptr[(this->fragments).data.field_0.fragments[z].stringPosition],z);
    this->framesDirty = true;
  }
  uVar6 = QFragmentMapData<QTextFragmentData>::erase_single(&(this->fragments).data,z);
  if (this->undoEnabled == false) {
    this->unreachableCharacterCount = this->unreachableCharacterCount + length;
  }
  adjustDocumentChangesAndCursors(this,pos,-length,op);
  return uVar6;
}

Assistant:

int QTextDocumentPrivate::remove_string(int pos, uint length, QTextUndoCommand::Operation op)
{
    Q_ASSERT(pos >= 0);
    Q_ASSERT(blocks.length() == fragments.length());
    Q_ASSERT(q20::cmp_greater_equal(blocks.length(), pos+length));

    int b = blocks.findNode(pos);
    uint x = fragments.findNode(pos);

    Q_ASSERT(blocks.size(b) > length);
    Q_ASSERT(x && q20::cmp_equal(fragments.position(x), pos) && fragments.size(x) == length);
    Q_ASSERT(noBlockInString(QStringView{text}.mid(fragments.fragment(x)->stringPosition, length)));

    blocks.setSize(b, blocks.size(b)-length);

    QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(fragments.fragment(x)->format));
    if (frame) {
        frame->d_func()->fragmentRemoved(text.at(fragments.fragment(x)->stringPosition), x);
        framesDirty = true;
    }

    const int w = fragments.erase_single(x);

    if (!undoEnabled)
        unreachableCharacterCount += length;

    adjustDocumentChangesAndCursors(pos, -int(length), op);

    return w;
}